

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

void __thiscall cfd::core::SchnorrPubkey::SchnorrPubkey(SchnorrPubkey *this,ByteData *data)

{
  bool bVar1;
  size_t sVar2;
  CfdException *pCVar3;
  SchnorrPubkey pk;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ByteData256::ByteData256(&this->data_);
  bVar1 = Pubkey::IsValid(data);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,&data->data_);
    Pubkey::Pubkey((Pubkey *)&local_50,(ByteData *)&local_38);
    FromPubkey(&pk,(Pubkey *)&local_50,(bool *)0x0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
  }
  else {
    sVar2 = ByteData::GetDataSize(data);
    if (sVar2 != 0x20) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pk,"Invalid Schnorr pubkey length.",(allocator *)&local_50);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&pk);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData256::ByteData256(&pk.data_,data);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk);
    bVar1 = ByteData256::IsEmpty(&this->data_);
    if (bVar1) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&pk,"Invalid Schnorr pubkey data.",(allocator *)&local_50);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&pk);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  return;
}

Assistant:

SchnorrPubkey::SchnorrPubkey(const ByteData &data) : data_() {
  if (Pubkey::IsValid(data)) {
    auto pk = SchnorrPubkey::FromPubkey(Pubkey(data));
    data_ = pk.data_;
  } else {
    if (data.GetDataSize() != SchnorrPubkey::kSchnorrPubkeySize) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr pubkey length.");
    }
    data_ = ByteData256(data);
    if (data_.IsEmpty()) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid Schnorr pubkey data.");
    }
  }
}